

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O1

void __thiscall
miniros::TopicManager::getBusInfoCallback
          (TopicManager *this,XmlRpcValue *params,XmlRpcValue *result)

{
  XmlRpcValue *pXVar1;
  XmlRpcValue response;
  string local_48;
  XmlRpcValue local_28;
  
  local_48._M_dataplus._M_p._0_4_ = 1;
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,0);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_48);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_28,&local_48);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,1);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_28);
  XmlRpc::XmlRpcValue::invalidate(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = local_48._M_dataplus._M_p & 0xffffffff00000000;
  local_48._M_string_length = 0;
  getBusInfo(this,(XmlRpcValue *)&local_48);
  pXVar1 = XmlRpc::XmlRpcValue::operator[](result,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,(XmlRpcValue *)&local_48);
  XmlRpc::XmlRpcValue::invalidate((XmlRpcValue *)&local_48);
  return;
}

Assistant:

void TopicManager::getBusInfoCallback(const XmlRpc::XmlRpcValue& params, XmlRpc::XmlRpcValue& result)
{
  (void)params;
  result[0] = 1;
  result[1] = std::string("");
  XmlRpcValue response;
  getBusInfo(response);
  result[2] = response;
}